

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateFixed(LodePNGBitWriter *writer,Hash *hash,uchar *data,size_t datapos,size_t dataend,
                 LodePNGCompressSettings *settings,uint final)

{
  uivector *in_RCX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  uivector *in_R8;
  Hash *in_R9;
  uint unaff_retaddr;
  uivector lz77_encoded;
  size_t i;
  uint error;
  uint BFINAL;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  LodePNGBitWriter *in_stack_ffffffffffffff30;
  HuffmanTree *in_stack_ffffffffffffff58;
  HuffmanTree *in_stack_ffffffffffffff60;
  uivector *in_stack_ffffffffffffff68;
  LodePNGBitWriter *in_stack_ffffffffffffff70;
  uint local_88;
  HuffmanTree local_80;
  uint in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  unsigned_short *in_stack_ffffffffffffffc8;
  
  local_88 = 0;
  HuffmanTree_init((HuffmanTree *)&stack0xffffffffffffffa8);
  HuffmanTree_init(&local_80);
  generateFixedLitLenTree
            ((HuffmanTree *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  generateFixedDistanceTree
            ((HuffmanTree *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  writeBits(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  writeBits(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  writeBits(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (*(int *)((long)&in_R9->head + 4) == 0) {
    for (; in_RCX < in_R8; in_RCX = (uivector *)((long)&in_RCX->data + 1)) {
      HuffmanTree_getCode((HuffmanTree *)&stack0xffffffffffffffa8,
                          (uint)*(byte *)((long)&in_RCX->data + in_RDX));
      HuffmanTree_getLength
                ((HuffmanTree *)&stack0xffffffffffffffa8,
                 (uint)*(byte *)((long)&in_RCX->data + in_RDX));
      writeBitsReversed(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
  }
  else {
    uivector_init((uivector *)&stack0xffffffffffffff58);
    in_stack_ffffffffffffff20 = *(undefined4 *)&in_R9->val;
    local_88 = encodeLZ77(in_R8,in_R9,(uchar *)in_stack_ffffffffffffffc8,
                          (size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb4,in_ESI,in_EDI,unaff_retaddr);
    if (local_88 == 0) {
      writeLZ77data(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58);
    }
    uivector_cleanup((void *)0x136ea6);
  }
  if (local_88 == 0) {
    HuffmanTree_getCode((HuffmanTree *)&stack0xffffffffffffffa8,0x100);
    HuffmanTree_getLength((HuffmanTree *)&stack0xffffffffffffffa8,0x100);
    writeBitsReversed(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  HuffmanTree_cleanup((HuffmanTree *)0x136f93);
  HuffmanTree_cleanup((HuffmanTree *)0x136f9d);
  return local_88;
}

Assistant:

static unsigned deflateFixed(LodePNGBitWriter* writer, Hash* hash,
                             const unsigned char* data,
                             size_t datapos, size_t dataend,
                             const LodePNGCompressSettings* settings, unsigned final) {
  HuffmanTree tree_ll; /*tree for literal values and length codes*/
  HuffmanTree tree_d; /*tree for distance codes*/

  unsigned BFINAL = final;
  unsigned error = 0;
  size_t i;

  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);

  generateFixedLitLenTree(&tree_ll);
  generateFixedDistanceTree(&tree_d);

  writeBits(writer, BFINAL, 1);
  writeBits(writer, 1, 1); /*first bit of BTYPE*/
  writeBits(writer, 0, 1); /*second bit of BTYPE*/

  if(settings->use_lz77) /*LZ77 encoded*/ {
    uivector lz77_encoded;
    uivector_init(&lz77_encoded);
    error = encodeLZ77(&lz77_encoded, hash, data, datapos, dataend, settings->windowsize,
                       settings->minmatch, settings->nicematch, settings->lazymatching);
    if(!error) writeLZ77data(writer, &lz77_encoded, &tree_ll, &tree_d);
    uivector_cleanup(&lz77_encoded);
  } else /*no LZ77, but still will be Huffman compressed*/ {
    for(i = datapos; i < dataend; ++i) {
      writeBitsReversed(writer, HuffmanTree_getCode(&tree_ll, data[i]), HuffmanTree_getLength(&tree_ll, data[i]));
    }
  }
  /*add END code*/
  if(!error) writeBitsReversed(writer, HuffmanTree_getCode(&tree_ll, 256), HuffmanTree_getLength(&tree_ll, 256));

  /*cleanup*/
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);

  return error;
}